

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O2

int __thiscall io::detail::AsynchronousReader::init(AsynchronousReader *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  anon_class_8_1_8991fb9c_for__M_head_impl local_38;
  undefined1 local_30 [8];
  unique_lock<std::mutex> guard;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->lock);
  std::__uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>::operator=
            ((__uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_> *)this,
             (__uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_> *)ctx);
  this->desired_byte_count = -1;
  this->termination_requested = false;
  local_38.this = this;
  std::thread::
  thread<io::detail::AsynchronousReader::init(std::unique_ptr<io::ByteSourceBase,std::default_delete<io::ByteSourceBase>>)::_lambda()_1_,,void>
            ((thread *)&guard._M_owns,&local_38);
  std::thread::operator=(&this->worker,(thread *)&guard._M_owns);
  std::thread::~thread((thread *)&guard._M_owns);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return extraout_EAX;
}

Assistant:

void init(std::unique_ptr<ByteSourceBase>arg_byte_source){
                                std::unique_lock<std::mutex>guard(lock);
                                byte_source = std::move(arg_byte_source);
                                desired_byte_count = -1;
                                termination_requested = false;
                                worker = std::thread(
                                        [&]{
                                                std::unique_lock<std::mutex>guard(lock);
                                                try{
                                                        for(;;){
                                                                read_requested_condition.wait(
                                                                        guard, 
                                                                        [&]{
                                                                                return desired_byte_count != -1 || termination_requested;
                                                                        }
                                                                );
                                                                if(termination_requested)
                                                                        return;

                                                                read_byte_count = byte_source->read(buffer, desired_byte_count);
                                                                desired_byte_count = -1;
                                                                if(read_byte_count == 0)
                                                                        break;
                                                                read_finished_condition.notify_one();
                                                        }
                                                }catch(...){
                                                        read_error = std::current_exception();
                                                }
                                                read_finished_condition.notify_one();
                                        }
                                );
                        }